

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Chapters::Edition::ExpandAtomsArray(Edition *this)

{
  Atom *pAVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Atom *this_00;
  ulong uVar6;
  Atom *local_a8;
  Atom *local_80;
  int local_74;
  int local_68;
  int idx;
  Atom *atoms;
  int size;
  Edition *this_local;
  
  if (this->m_atoms_count < this->m_atoms_size) {
    this_local._7_1_ = true;
  }
  else {
    if (this->m_atoms_size == 0) {
      local_74 = 1;
    }
    else {
      local_74 = this->m_atoms_size << 1;
    }
    uVar3 = (ulong)local_74;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x30),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_80 = (Atom *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_80 = (Atom *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a8 = local_80;
        do {
          Atom::Atom(local_a8);
          local_a8 = local_a8 + 1;
        } while (local_a8 != local_80 + uVar3);
      }
    }
    if (local_80 == (Atom *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_68 = 0; local_68 < this->m_atoms_count; local_68 = local_68 + 1) {
        Atom::ShallowCopy(this->m_atoms + local_68,local_80 + local_68);
      }
      pAVar1 = this->m_atoms;
      if (pAVar1 != (Atom *)0x0) {
        this_00 = pAVar1 + *(long *)&pAVar1[-1].m_displays_size;
        while (pAVar1 != this_00) {
          this_00 = this_00 + -1;
          Atom::~Atom(this_00);
        }
        operator_delete__(&pAVar1[-1].m_displays_size);
      }
      this->m_atoms = local_80;
      this->m_atoms_size = local_74;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Chapters::Edition::ExpandAtomsArray() {
  if (m_atoms_size > m_atoms_count)
    return true;  // nothing else to do

  const int size = (m_atoms_size == 0) ? 1 : 2 * m_atoms_size;

  Atom* const atoms = new (std::nothrow) Atom[size];

  if (atoms == NULL)
    return false;

  for (int idx = 0; idx < m_atoms_count; ++idx) {
    m_atoms[idx].ShallowCopy(atoms[idx]);
  }

  delete[] m_atoms;
  m_atoms = atoms;

  m_atoms_size = size;
  return true;
}